

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O1

void UnitTest::
     ExecuteTest<(anonymous_namespace)::TestSuiteFixtureTestRunnerRunsAllSuitesIfNullSuiteIsPassedHelper>
               (TestSuiteFixtureTestRunnerRunsAllSuitesIfNullSuiteIsPassedHelper *testObject,
               TestDetails *details)

{
  TestResults *results;
  int iVar1;
  TestDetails **ppTVar2;
  TestResults **ppTVar3;
  undefined8 *puVar4;
  SignalTranslator sig;
  int local_4b4;
  TestDetails local_4b0;
  SignalTranslator local_490;
  
  ppTVar2 = CurrentTest::Details();
  *ppTVar2 = details;
  SignalTranslator::SignalTranslator(&local_490);
  iVar1 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar1 == 0) {
    TestRunner::RunTestsIf<UnitTest::True>
              (&(testObject->super_TestSuiteFixture).runner,
               &(testObject->super_TestSuiteFixture).list,(char *)0x0,(True *)&local_4b0,0);
    ppTVar3 = CurrentTest::Results();
    results = *ppTVar3;
    local_4b4 = 2;
    ppTVar2 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4b0,*ppTVar2,0xf1);
    CheckEqual<int,int>(results,&local_4b4,
                        &(testObject->super_TestSuiteFixture).reporter.summaryTotalTestCount,
                        &local_4b0);
    SignalTranslator::~SignalTranslator(&local_490);
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = "Unhandled system exception";
  __cxa_throw(puVar4,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}